

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O1

attributes_t * __thiscall
tchecker::syncprod::synchronizer_t::attributes
          (attributes_t *__return_storage_ptr__,synchronizer_t *this,state_t *state)

{
  no_storage_array_t<unsigned_int> *pnVar1;
  uint uVar2;
  element_type *peVar3;
  long lVar4;
  long lVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *pmVar6;
  int iVar7;
  long lVar8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
  _Var9;
  uint uVar10;
  no_storage_array_t<unsigned_int> *pnVar11;
  range_t<tchecker::system::attributes_t::const_iterator_t,_tchecker::system::attributes_t::const_iterator_t>
  rVar12;
  attr_parsing_position_t local_b8;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_map)._M_h._M_buckets =
       &(__return_storage_ptr__->_map)._M_h._M_single_bucket;
  (__return_storage_ptr__->_map)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_map)._M_h._M_element_count = 0;
  (__return_storage_ptr__->_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pnVar11 = (no_storage_array_t<unsigned_int> *)(state->_vloc)._t;
  if (pnVar11 != (no_storage_array_t<unsigned_int> *)0x0) {
    if ((ulong)*(uint *)&pnVar11->field_0x0 == 0) {
      uVar10 = 0;
    }
    else {
      pnVar1 = pnVar11 + *(uint *)&pnVar11->field_0x0;
      uVar10 = 0;
      do {
        uVar2 = *(uint *)&pnVar11[1].field_0x0;
        peVar3 = (this->_system).
                 super___shared_ptr<const_tchecker::syncprod::system_t,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        lVar4 = *(long *)&(peVar3->super_system_t).super_locs_t._locs.
                          super__Vector_base<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
                          ._M_impl.super__Vector_impl_data;
        if ((ulong)((long)*(pointer *)
                           ((long)&(peVar3->super_system_t).super_locs_t._locs.
                                   super__Vector_base<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
                           + 8) - lVar4 >> 4) <= (ulong)uVar2) {
          __assert_fail("id < _locs.size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/system/loc.hh"
                        ,0xc3,
                        "tchecker::system::loc_const_shared_ptr_t tchecker::system::locs_t::location(tchecker::loc_id_t) const"
                       );
        }
        lVar8 = (ulong)uVar2 * 0x10;
        lVar5 = *(long *)(lVar4 + lVar8);
        if (*(uint *)(lVar5 + 4) != uVar2) {
          __assert_fail("_locs[id]->id() == id",
                        "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/system/loc.hh"
                        ,0xc4,
                        "tchecker::system::loc_const_shared_ptr_t tchecker::system::locs_t::location(tchecker::loc_id_t) const"
                       );
        }
        this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar4 + lVar8 + 8);
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        rVar12 = tchecker::system::attributes_t::range((attributes_t *)(lVar5 + 0x28));
        _Var9._M_cur = (__node_type *)
                       rVar12._begin.super_const_iterator.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
                       ._M_cur;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        for (; _Var9._M_cur !=
               (__node_type *)
               rVar12._end.super_const_iterator.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
               ._M_cur; _Var9._M_cur = *_Var9._M_cur) {
          iVar7 = std::__cxx11::string::compare((char *)((long)_Var9._M_cur + 0x28));
          if (iVar7 == 0) {
            uVar10 = uVar10 + 1;
          }
          else {
            tchecker::system::attr_parsing_position_t::attr_parsing_position_t
                      ((attr_parsing_position_t *)&local_b8,
                       (attr_parsing_position_t *)((long)_Var9._M_cur + 0x68));
            tchecker::system::attributes_t::add_attribute
                      (__return_storage_ptr__,(string *)((long)_Var9._M_cur + 0x28),
                       (string *)((long)_Var9._M_cur + 0x48),(attr_parsing_position_t *)&local_b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._value_position._M_dataplus._M_p != &local_b8._value_position.field_2) {
              operator_delete(local_b8._value_position._M_dataplus._M_p,
                              local_b8._value_position.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._key_position._M_dataplus._M_p != &local_b8._key_position.field_2) {
              operator_delete(local_b8._key_position._M_dataplus._M_p,
                              local_b8._key_position.field_2._M_allocated_capacity + 1);
            }
          }
        }
        pnVar11 = pnVar11 + 1;
      } while (pnVar11 != pnVar1);
    }
    pmVar6 = (state->_vloc)._t;
    if (pmVar6 != (make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *)0x0) {
      if (uVar10 == (pmVar6->super_vloc_t).super_loc_array_t.super_vloc_base_t.
                    super_array_capacity_t<unsigned_int>._capacity) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"initial","");
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
        local_b8._value_position.field_2._M_allocated_capacity = 0;
        local_b8._value_position.field_2._8_8_ = 0;
        local_b8._value_position._M_dataplus._M_p = (pointer)0x0;
        local_b8._value_position._M_string_length = 0;
        local_b8._key_position.field_2._M_allocated_capacity = 0;
        local_b8._key_position.field_2._8_8_ = 0;
        local_b8._key_position._M_dataplus._M_p = (pointer)0x0;
        local_b8._key_position._M_string_length = 0;
        parsing::attr_parsing_position_t::attr_parsing_position_t(&local_b8);
        tchecker::system::attributes_t::add_attribute
                  (__return_storage_ptr__,&local_50,&local_70,(attr_parsing_position_t *)&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._value_position._M_dataplus._M_p != &local_b8._value_position.field_2) {
          operator_delete(local_b8._value_position._M_dataplus._M_p,
                          local_b8._value_position.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._key_position._M_dataplus._M_p != &local_b8._key_position.field_2) {
          operator_delete(local_b8._key_position._M_dataplus._M_p,
                          local_b8._key_position.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      return __return_storage_ptr__;
    }
  }
  __assert_fail("_t != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                ,0x1d0,
                "T &tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t>>::operator*() const [T = tchecker::make_shared_t<tchecker::vloc_t>]"
               );
}

Assistant:

tchecker::system::attributes_t attributes(tchecker::syncprod::state_t const & state)
  {
    tchecker::process_id_t count_initial = 0;
    tchecker::system::attributes_t attributes;
    for (tchecker::loc_id_t id : state.vloc())
      for (auto && attr : _system->location(id)->attributes().range()) {
        if (attr.key() == "initial")
          ++count_initial;
        else
          attributes.add_attribute(attr.key(), attr.value(), attr.parsing_position());
      }
    if (count_initial == state.vloc().size()) // all processes initial
      attributes.add_attribute("initial", "", tchecker::system::attr_parsing_position_t{});
    return attributes;
  }